

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

uintm __thiscall
ParserContext::getInstructionBytes(ParserContext *this,int4 bytestart,int4 size,uint4 off)

{
  uintm uVar1;
  LowlevelError *this_00;
  ulong uVar2;
  ulong uVar3;
  allocator local_39;
  string local_38;
  
  if (bytestart + off < 0x10) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)size;
    if (size < 1) {
      uVar2 = uVar3;
    }
    uVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = uVar1 << 8 | (uint)this->buf[uVar3 + (bytestart + off)];
    }
    return uVar1;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)&local_38,"Instruction is using more than 16 bytes",&local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&BadDataError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

uintm ParserContext::getInstructionBytes(int4 bytestart,int4 size,uint4 off) const

{				// Get bytes from the instruction stream into a intm
				// (assuming big endian format)
  off += bytestart;
  if (off >=16)
    throw BadDataError("Instruction is using more than 16 bytes"); 
  const uint1 *ptr = buf + off;
  uintm res = 0;
  for(int4 i=0;i<size;++i) {
    res <<= 8;
    res |= ptr[i];
  }
  return res;
}